

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O2

bool __thiscall GF2::VSubst<8UL>::IsFullCycle(VSubst<8UL> *this)

{
  word wVar1;
  long lVar2;
  WW<8UL> *pWVar3;
  
  lVar2 = 0xff;
  pWVar3 = (WW<8UL> *)this;
  while (wVar1 = (((VFunc<8UL,_8UL> *)pWVar3->_words)->super_Func<8UL,_GF2::WW<8UL>_>)._vals[0].
                 _words[0], wVar1 != 0) {
    pWVar3 = (this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals + wVar1;
    lVar2 = lVar2 + -1;
  }
  return lVar2 == 0;
}

Assistant:

bool IsFullCycle() const
	{	
		assert(IsBijection());
		word x = Get(0);
		size_t count = 1;
		while (x != 0)
			x = Get(x), ++count;
		return count == _size;
	}